

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O1

void __thiscall
kratos::VarException::VarException(VarException *this,string *message,iterator begin,iterator end)

{
  iterator it;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)message);
  *(undefined ***)this = &PTR__runtime_error_002b5ac0;
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    print_ast_node(&(*begin._M_current)->super_IRNode);
  }
  return;
}

Assistant:

VarException::VarException(const std::string& message, std::vector<const Var*>::iterator begin,
                           std::vector<const Var*>::iterator end) noexcept
    : std::runtime_error(message) {
    for (auto it = begin; it != end; it++) {
        print_ast_node(*it);
    }
}